

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SimdBool8x16<Js::OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  int iVar1;
  SIMDValue bValue;
  AsmJsSIMDValue result;
  bool values [16];
  OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I1);
  result.field_0.i8[8] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I2);
  result.field_0.i8[9] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I3);
  result.field_0.i8[10] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I4);
  result.field_0.i8[0xb] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I5);
  result.field_0.i8[0xc] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I6);
  result.field_0.i8[0xd] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I7);
  result.field_0.i8[0xe] = iVar1 != 0;
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I8);
  result.field_0.i8[0xf] = iVar1 != 0;
  GetRegRawInt<unsigned_int>(this,playout->I9);
  GetRegRawInt<unsigned_int>(this,playout->I10);
  GetRegRawInt<unsigned_int>(this,playout->I11);
  GetRegRawInt<unsigned_int>(this,playout->I12);
  GetRegRawInt<unsigned_int>(this,playout->I13);
  GetRegRawInt<unsigned_int>(this,playout->I14);
  GetRegRawInt<unsigned_int>(this,playout->I15);
  GetRegRawInt<unsigned_int>(this,playout->I16);
  bValue = SIMDBool8x16Operation::OpBool8x16((bool *)(result.field_0.i8 + 8));
  SetRegRawSimd<unsigned_int>(this,playout->B16_0,(AsmJsSIMDValue)bValue.field_0);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdBool8x16(const unaligned T* playout)
    {
        bool values[16];
        values[0] = GetRegRawInt(playout->I1) ? true : false;
        values[1] = GetRegRawInt(playout->I2) ? true : false;
        values[2] = GetRegRawInt(playout->I3) ? true : false;
        values[3] = GetRegRawInt(playout->I4) ? true : false;
        values[4] = GetRegRawInt(playout->I5) ? true : false;
        values[5] = GetRegRawInt(playout->I6) ? true : false;
        values[6] = GetRegRawInt(playout->I7) ? true : false;
        values[7] = GetRegRawInt(playout->I8) ? true : false;
        values[8] = GetRegRawInt(playout->I9) ? true : false;
        values[9] = GetRegRawInt(playout->I10) ? true : false;
        values[10] = GetRegRawInt(playout->I11) ? true : false;
        values[11] = GetRegRawInt(playout->I12) ? true : false;
        values[12] = GetRegRawInt(playout->I13) ? true : false;
        values[13] = GetRegRawInt(playout->I14) ? true : false;
        values[14] = GetRegRawInt(playout->I15) ? true : false;
        values[15] = GetRegRawInt(playout->I16) ? true : false;

        AsmJsSIMDValue result = SIMDBool8x16Operation::OpBool8x16(values);
        SetRegRawSimd(playout->B16_0, result);
    }